

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testSpecDowngradeFlexibleShapes(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  ArrayFeatureType_ShapeRange *pAVar6;
  SizeRange *pSVar7;
  NeuralNetwork *pNVar8;
  NeuralNetworkLayer *this;
  UnaryFunctionLayerParams *pUVar9;
  Model *pMVar10;
  ostream *poVar11;
  uint uVar12;
  Model mlmodel;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  m1.specificationversion_ = 3;
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  pAVar6 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(pAVar5);
  pSVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::Add
                     (&pAVar6->sizeranges_);
  pSVar7->lowerbound_ = 10;
  pSVar7->upperbound_ = 10;
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10040;
  pNVar8 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar8->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"probs");
  pUVar9 = CoreML::Specification::NeuralNetworkLayer::mutable_unary(this);
  pUVar9->type_ = 6;
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    CoreML::Model::Model(&mlmodel,&m1);
    pMVar10 = CoreML::Model::getProto(&mlmodel);
    bVar1 = pMVar10->specificationversion_ != 3;
    if (bVar1) {
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar11 = std::operator<<(poVar11,":");
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x1050);
      poVar11 = std::operator<<(poVar11,": error: ");
      poVar11 = std::operator<<(poVar11,
                                "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12"
                               );
      poVar11 = std::operator<<(poVar11," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    uVar12 = (uint)bVar1;
    CoreML::Model::~Model(&mlmodel);
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x104c);
    poVar11 = std::operator<<(poVar11,": error: ");
    poVar11 = std::operator<<(poVar11,"(res).good()");
    poVar11 = std::operator<<(poVar11," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar11);
    uVar12 = 1;
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return uVar12;
}

Assistant:

int testSpecDowngradeFlexibleShapes() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *array_type = topIn->mutable_type()->mutable_multiarraytype();
    array_type->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *array_shape1_range = array_type->mutable_shaperange()->add_sizeranges();
    array_shape1_range->set_lowerbound(10);
    array_shape1_range->set_upperbound(10);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");

    auto *params = layer->mutable_unary();
    params->set_type(Specification::UnaryFunctionLayerParams::ABS);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12);

    return 0;

}